

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

ScalarFunction * duckdb::MapFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  code *local_148 [2];
  code *local_138;
  code *local_130;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_128;
  LogicalType local_108 [24];
  LogicalType local_f0 [24];
  LogicalType local_d8 [24];
  BaseScalarFunction local_c0 [176];
  
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_108,MAP);
  local_148[1] = (code *)0x0;
  local_148[0] = MapFunction;
  local_130 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_f0,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_f0);
  std::_Function_base::~_Function_base((_Function_base *)local_148);
  duckdb::LogicalType::~LogicalType(local_108);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_128);
  duckdb::LogicalType::LogicalType(local_d8,ANY);
  LogicalType::operator=((LogicalType *)&in_RDI->field_0x78,local_d8);
  duckdb::LogicalType::~LogicalType(local_d8);
  BaseScalarFunction::SetReturnsError(local_c0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_c0);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction MapFun::GetFunction() {
	ScalarFunction fun({}, LogicalTypeId::MAP, MapFunction, MapBind);
	fun.varargs = LogicalType::ANY;
	BaseScalarFunction::SetReturnsError(fun);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}